

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::MILSpec::Value_BlobFileValue::MergePartialFromCodedStream
          (Value_BlobFileValue *this,CodedInputStream *input)

{
  ArenaStringPtr *this_00;
  byte bVar1;
  byte *pbVar2;
  uint8 *puVar3;
  bool bVar4;
  uint32 uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  pair<unsigned_long,_bool> pVar10;
  
  this_00 = &this->filename_;
  do {
    pbVar2 = input->buffer_;
    uVar5 = 0;
    if (pbVar2 < input->buffer_end_) {
      bVar1 = *pbVar2;
      uVar5 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_00154ac8;
      input->buffer_ = pbVar2 + 1;
      uVar8 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_00154ac8:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar8 = 0;
      if (uVar5 - 1 < 0x7f) {
        uVar8 = 0x100000000;
      }
      uVar8 = uVar5 | uVar8;
    }
    uVar5 = (uint32)uVar8;
    iVar9 = 6;
    iVar7 = iVar9;
    if ((uVar8 & 0x100000000) == 0) {
LAB_00154b68:
      iVar7 = 7;
      if ((uVar5 & 7) != 4 && uVar5 != 0) {
        bVar4 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
LAB_00154b87:
        iVar7 = iVar9;
        if (bVar4 != false) goto LAB_00154b8e;
      }
    }
    else {
      uVar6 = (uint)(uVar8 >> 3) & 0x1fffffff;
      if (uVar6 == 2) {
        if ((char)uVar8 != '\x10') goto LAB_00154b68;
        puVar3 = input->buffer_;
        if ((puVar3 < input->buffer_end_) && (-1 < (long)(char)*puVar3)) {
          this->offset_ = (long)(char)*puVar3;
          input->buffer_ = puVar3 + 1;
        }
        else {
          pVar10 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->offset_ = pVar10.first;
          if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_00154b90;
        }
LAB_00154b8e:
        iVar7 = 0;
      }
      else {
        if ((uVar6 != 1) || ((char)uVar8 != '\n')) goto LAB_00154b68;
        if (this_00->ptr_ ==
            (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (this_00,(string *)
                             &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar4 = google::protobuf::internal::WireFormatLite::ReadBytes(input,this_00->ptr_);
        if (bVar4) {
          bVar4 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            ((this_00->ptr_->_M_dataplus)._M_p,(int)this_00->ptr_->_M_string_length,
                             PARSE,"CoreML.Specification.MILSpec.Value.BlobFileValue.fileName");
          goto LAB_00154b87;
        }
      }
    }
LAB_00154b90:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool Value_BlobFileValue::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.MILSpec.Value.BlobFileValue)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // string fileName = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_filename()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->filename().data(), this->filename().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.MILSpec.Value.BlobFileValue.fileName"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 offset = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &offset_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.MILSpec.Value.BlobFileValue)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.MILSpec.Value.BlobFileValue)
  return false;
#undef DO_
}